

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

Privkey * __thiscall
cfd::core::TapBranch::GetTweakedPrivkey
          (Privkey *__return_storage_ptr__,TapBranch *this,Privkey *internal_privkey,bool *parity)

{
  pointer puVar1;
  bool is_parity;
  ByteData256 hash;
  Privkey privkey;
  SchnorrPubkey internal_pubkey;
  bool local_99;
  Privkey local_98;
  Privkey local_70;
  SchnorrPubkey local_50;
  SchnorrPubkey local_38;
  
  local_99 = false;
  SchnorrPubkey::FromPrivkey(&local_50,internal_privkey,&local_99);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)internal_privkey);
  local_70.is_compressed_ = internal_privkey->is_compressed_;
  local_70._25_3_ = *(undefined3 *)&internal_privkey->field_0x19;
  local_70.net_type_ = internal_privkey->net_type_;
  if (local_99 == true) {
    Privkey::CreateNegate(&local_98,internal_privkey);
    puVar1 = local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    local_70.is_compressed_ = local_98.is_compressed_;
    local_70._25_3_ = local_98._25_3_;
    local_70.net_type_ = local_98.net_type_;
    if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  GetTapTweak((ByteData256 *)&local_98,this,&local_50);
  SchnorrPubkey::CreateTweakAdd(&local_38,&local_50,(ByteData256 *)&local_98,&local_99);
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (parity != (bool *)0x0) {
    *parity = local_99;
  }
  Privkey::CreateTweakAdd(__return_storage_ptr__,&local_70,(ByteData256 *)&local_98);
  if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey TapBranch::GetTweakedPrivkey(
    const Privkey& internal_privkey, bool* parity) const {
  bool is_parity = false;
  auto internal_pubkey =
      SchnorrPubkey::FromPrivkey(internal_privkey, &is_parity);
  Privkey privkey = internal_privkey;
  if (is_parity) privkey = internal_privkey.CreateNegate();

  ByteData256 hash = GetTapTweak(internal_pubkey);
  internal_pubkey.CreateTweakAdd(hash, &is_parity);
  if (parity != nullptr) *parity = is_parity;
  return privkey.CreateTweakAdd(hash);
}